

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O2

void __thiscall
QAccessibleAbstractSlider::QAccessibleAbstractSlider
          (QAccessibleAbstractSlider *this,QWidget *w,Role r)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  local_38.size = 0;
  QAccessibleWidget::QAccessibleWidget(&this->super_QAccessibleWidget,w,r,(QString *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  *(undefined ***)&this->super_QAccessibleWidget = &PTR__QAccessibleAbstractSlider_007e2ef8;
  *(undefined ***)&(this->super_QAccessibleWidget).super_QAccessibleActionInterface =
       &PTR__QAccessibleAbstractSlider_007e2ff0;
  *(undefined ***)&this->super_QAccessibleValueInterface = &PTR__QAccessibleAbstractSlider_007e3038;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleAbstractSlider::QAccessibleAbstractSlider(QWidget *w, QAccessible::Role r)
    : QAccessibleWidget(w, r)
{
    Q_ASSERT(qobject_cast<QAbstractSlider *>(w));
}